

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

bool __thiscall
cmMakefileTargetGenerator::WriteMakeRule
          (cmMakefileTargetGenerator *this,ostream *os,char *comment,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *depends,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *commands,bool in_help)

{
  bool bVar1;
  value_type *__value;
  bool symbolic;
  bool symbolic_00;
  cmSourceFile *pcVar2;
  string *psVar3;
  value_type p;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output_commands;
  string out;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output_depends;
  
  psVar3 = (outputs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((outputs->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != psVar3) {
    bVar1 = (this->GlobalGenerator->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
            NeedSymbolicMark;
    if ((bVar1 == true) &&
       (pcVar2 = cmMakefile::GetSource((this->super_cmCommonTargetGenerator).Makefile,psVar3),
       pcVar2 != (cmSourceFile *)0x0)) {
      p.first._M_dataplus._M_p = (pointer)&p.first.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&p,"SYMBOLIC","");
      symbolic = cmSourceFile::GetPropertyAsBool(pcVar2,&p.first);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)p.first._M_dataplus._M_p != &p.first.field_2) {
        operator_delete(p.first._M_dataplus._M_p,p.first.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      symbolic = false;
    }
    cmLocalUnixMakefileGenerator3::WriteMakeRule
              (this->LocalGenerator,os,comment,
               (outputs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,depends,commands,symbolic,in_help);
    __value = (outputs->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if ((long)(outputs->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)__value != 0x20) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&output_depends,1,__value,(allocator_type *)&p);
      psVar3 = (outputs->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + 1;
      if (psVar3 != (outputs->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish) {
        do {
          cmCommonTargetGenerator::Convert
                    (&out,&this->super_cmCommonTargetGenerator,psVar3,HOME_OUTPUT,SHELL);
          output_commands.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          output_commands.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          output_commands.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if ((bVar1 == false) ||
             (pcVar2 = cmMakefile::GetSource((this->super_cmCommonTargetGenerator).Makefile,psVar3),
             pcVar2 == (cmSourceFile *)0x0)) {
            symbolic_00 = false;
          }
          else {
            p.first._M_dataplus._M_p = (pointer)&p.first.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&p,"SYMBOLIC","");
            symbolic_00 = cmSourceFile::GetPropertyAsBool(pcVar2,&p.first);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)p.first._M_dataplus._M_p != &p.first.field_2) {
              operator_delete(p.first._M_dataplus._M_p,p.first.field_2._M_allocated_capacity + 1);
            }
          }
          if (symbolic_00 == false) {
            std::operator+(&p.first,"@$(CMAKE_COMMAND) -E touch_nocreate ",&out);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &output_commands,&p.first);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)p.first._M_dataplus._M_p != &p.first.field_2) {
              operator_delete(p.first._M_dataplus._M_p,p.first.field_2._M_allocated_capacity + 1);
            }
          }
          cmLocalUnixMakefileGenerator3::WriteMakeRule
                    (this->LocalGenerator,os,(char *)0x0,psVar3,&output_depends,&output_commands,
                     symbolic_00,in_help);
          if (symbolic_00 == false) {
            std::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::
            pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      (&p,psVar3,
                       (outputs->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start);
            std::
            _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
            ::_M_emplace_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>&>
                      ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                        *)&this->MultipleOutputPairs,&p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)p.second._M_dataplus._M_p != &p.second.field_2) {
              operator_delete(p.second._M_dataplus._M_p,p.second.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)p.first._M_dataplus._M_p != &p.first.field_2) {
              operator_delete(p.first._M_dataplus._M_p,p.first.field_2._M_allocated_capacity + 1);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&output_commands);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)out._M_dataplus._M_p != &out.field_2) {
            operator_delete(out._M_dataplus._M_p,out.field_2._M_allocated_capacity + 1);
          }
          symbolic = (bool)(symbolic & symbolic_00);
          psVar3 = psVar3 + 1;
        } while (psVar3 != (outputs->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&output_depends);
    }
    return symbolic;
  }
  return false;
}

Assistant:

bool cmMakefileTargetGenerator::WriteMakeRule(
  std::ostream& os,
  const char* comment,
  const std::vector<std::string>& outputs,
  const std::vector<std::string>& depends,
  const std::vector<std::string>& commands,
  bool in_help)
{
  bool symbolic = false;
  if (outputs.size() == 0)
    {
    return symbolic;
    }

  // Check whether we need to bother checking for a symbolic output.
  bool need_symbolic = this->GlobalGenerator->GetNeedSymbolicMark();

  // Check whether the first output is marked as symbolic.
  if(need_symbolic)
    {
    if(cmSourceFile* sf = this->Makefile->GetSource(outputs[0]))
      {
      symbolic = sf->GetPropertyAsBool("SYMBOLIC");
      }
    }

  // We always attach the actual commands to the first output.
  this->LocalGenerator->WriteMakeRule(os, comment, outputs[0], depends,
                                      commands, symbolic, in_help);

  // For single outputs, we are done.
  if (outputs.size() == 1)
    {
    return symbolic;
    }

  // For multiple outputs, make the extra ones depend on the first one.
  std::vector<std::string> const output_depends(1, outputs[0]);
  for (std::vector<std::string>::const_iterator o = outputs.begin()+1;
       o != outputs.end(); ++o)
    {
    // Touch the extra output so "make" knows that it was updated,
    // but only if the output was acually created.
    std::string const out = this->Convert(*o, cmLocalGenerator::HOME_OUTPUT,
                                          cmLocalGenerator::SHELL);
    std::vector<std::string> output_commands;

    bool o_symbolic = false;
    if(need_symbolic)
      {
      if(cmSourceFile* sf = this->Makefile->GetSource(*o))
        {
        o_symbolic = sf->GetPropertyAsBool("SYMBOLIC");
        }
      }
    symbolic = symbolic && o_symbolic;

    if (!o_symbolic)
      {
      output_commands.push_back("@$(CMAKE_COMMAND) -E touch_nocreate " + out);
      }
    this->LocalGenerator->WriteMakeRule(os, 0, *o, output_depends,
                                        output_commands, o_symbolic, in_help);

    if (!o_symbolic)
      {
      // At build time, remove the first output if this one does not exist
      // so that "make" will rerun the real commands that create this one.
      MultipleOutputPairsType::value_type p(*o, outputs[0]);
      this->MultipleOutputPairs.insert(p);
      }
    }
  return symbolic;
}